

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O3

FArchive * operator<<(FArchive *arc,FDoorAnimation **Doorani)

{
  undefined8 in_RAX;
  FDoorAnimation *pFVar1;
  ulong uVar2;
  FTextureID tex;
  FTextureID local_14;
  
  local_14.texnum = (int)((ulong)in_RAX >> 0x20);
  if (arc->m_Storing == true) {
    operator<<(arc,&(*Doorani)->BaseTexture);
  }
  else {
    operator<<(arc,&local_14);
    pFVar1 = TexMan.mAnimatedDoors.Array;
    for (uVar2 = (ulong)TexMan.mAnimatedDoors.Count; uVar2 != 0; uVar2 = uVar2 - 1) {
      if ((pFVar1->BaseTexture).texnum == local_14.texnum) goto LAB_00636fa5;
      pFVar1 = pFVar1 + 1;
    }
    pFVar1 = (FDoorAnimation *)0x0;
LAB_00636fa5:
    *Doorani = pFVar1;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FDoorAnimation* &Doorani)
{
	if (arc.IsStoring())
	{
		arc << Doorani->BaseTexture;
	}
	else
	{
		FTextureID tex;
		arc << tex;
		Doorani = TexMan.FindAnimatedDoor(tex);
	}
	return arc;
}